

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O0

bool __thiscall SVGChart::PPlot::DrawXAxis(PPlot *this,PRect *inRect,Painter *inPainter)

{
  _func_int **pp_Var1;
  _func_int **pp_Var2;
  _func_int **pp_Var3;
  Painter *pPVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  undefined8 uVar8;
  float extraout_XMM0_Da;
  int theY;
  int theX_1;
  int theW;
  string theLabel;
  int local_c0;
  PRect theRect;
  undefined1 local_90 [8];
  PRect theTickRect;
  string local_68 [4];
  int theYMax;
  string theFormatString;
  undefined4 local_40;
  bool theIsMajorTick;
  float theX;
  float theY2;
  float theX2;
  float theTargetY;
  float theY1;
  float theX1;
  Painter *inPainter_local;
  PRect *inRect_local;
  PPlot *this_local;
  
  _theY1 = inPainter;
  inPainter_local = (Painter *)inRect;
  inRect_local = (PRect *)this;
  (*inPainter->_vptr_Painter[0xc])(inPainter,&(this->mXAxisSetup).mStyle);
  theTargetY = (float)(long)inPainter_local->_vptr_Painter;
  theY2 = 0.0;
  if (((this->mXAxisSetup).mCrossOrigin & 1U) == 0) {
    if (((this->mYAxisSetup).mAscending & 1U) == 0) {
      theY2 = (this->mYAxisSetup).mMin;
    }
    else {
      theY2 = (this->mYAxisSetup).mMax;
    }
  }
  (*this->mYTrafo->_vptr_Trafo[2])(theY2);
  theX = theTargetY + (float)(long)inPainter_local[2]._vptr_Painter;
  theX2 = extraout_XMM0_Da;
  (**_theY1->_vptr_Painter)(theTargetY,extraout_XMM0_Da,theX,extraout_XMM0_Da);
  (*_theY1->_vptr_Painter[0xc])(_theY1,&(this->mXAxisSetup).mTickInfo.mStyle);
  uVar5 = (*this->mXTickIterator->_vptr_TickIterator[2])();
  if ((uVar5 & 1) == 0) {
    this_local._7_1_ = 0;
  }
  else {
    std::__cxx11::string::string(local_68);
    theTickRect.mH._4_4_ = 0;
    PRect::PRect((PRect *)local_90);
    pp_Var1 = inPainter_local->_vptr_Painter;
    pp_Var2 = inPainter_local[1]._vptr_Painter;
    pp_Var3 = inPainter_local[2]._vptr_Painter;
    theRect.mW = (long)inPainter_local[3]._vptr_Painter;
    if (((this->mXAxisSetup).mTickInfo.mTicksOn & 1U) != 0) {
      while (uVar5 = (*this->mXTickIterator->_vptr_TickIterator[3])
                               (this->mXTickIterator,&local_40,
                                (undefined1 *)((long)&theFormatString.field_2 + 0xf),local_68),
            (uVar5 & 1) != 0) {
        uVar5 = (*(this->super_PDrawer)._vptr_PDrawer[0xc])
                          (local_40,this,(ulong)(uint)(int)theX2,
                           (ulong)((byte)theFormatString.field_2._M_local_buf[0xf] & 1),local_68,
                           _theY1,local_90);
        if ((uVar5 & 1) == 0) {
          this_local._7_1_ = 0;
          theLabel.field_2._12_4_ = 1;
          goto LAB_00108e2c;
        }
        if ((long)theTickRect.mH._4_4_ < theTickRect.mX + theTickRect.mW) {
          theTickRect.mH._4_4_ = (int)theTickRect.mX + (int)theTickRect.mW;
        }
      }
    }
    if ((long)pp_Var2 + theRect.mW < (long)theTickRect.mH._4_4_) {
      theRect.mW = (long)theTickRect.mH._4_4_ - (long)pp_Var2;
    }
    (*_theY1->_vptr_Painter[0xc])(_theY1,&(this->mXAxisSetup).mStyle);
    std::__cxx11::string::string((string *)&theX_1,(string *)&(this->mXAxisSetup).mLabel);
    lVar7 = std::__cxx11::string::size();
    pPVar4 = _theY1;
    if (lVar7 != 0) {
      uVar8 = std::__cxx11::string::c_str();
      iVar6 = (*pPVar4->_vptr_Painter[8])(pPVar4,uVar8);
      local_c0 = (int)pp_Var1;
      lVar7 = (long)pp_Var3 - (long)iVar6;
      iVar6 = (*_theY1->_vptr_Painter[9])();
      pPVar4 = _theY1;
      uVar8 = std::__cxx11::string::c_str();
      (*pPVar4->_vptr_Painter[10])
                (pPVar4,(ulong)(uint)(local_c0 + (int)((ulong)(lVar7 - (lVar7 >> 0x3f)) >> 1)),
                 (ulong)(uint)((int)pp_Var2 + (int)theRect.mW + iVar6),uVar8);
    }
    this_local._7_1_ = 1;
    theLabel.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)&theX_1);
LAB_00108e2c:
    std::__cxx11::string::~string(local_68);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool PPlot::DrawXAxis (const PRect &inRect, Painter &inPainter) const {
      inPainter.SetStyle (mXAxisSetup.mStyle);

      float theX1 = inRect.mX;
      float theY1;
      float theTargetY = 0;
      if (!mXAxisSetup.mCrossOrigin) {
        if (mYAxisSetup.mAscending) {
          theTargetY = mYAxisSetup.mMax;
        } else {
          theTargetY = mYAxisSetup.mMin;
        }
      }
      theY1 = mYTrafo->Transform (theTargetY);

      // x-axis
      float theX2 = theX1+inRect.mW;
      float theY2 = theY1;
      inPainter.DrawLine (theX1, theY1, theX2, theY2);

      // ticks
      inPainter.SetStyle (mXAxisSetup.mTickInfo.mStyle);
      if (!mXTickIterator->Init ()) {
        return false;
      }

      float theX;
      bool theIsMajorTick;
      string theFormatString;

      int theYMax = 0;
      PRect theTickRect;
      PRect theRect = inRect;

      if (mXAxisSetup.mTickInfo.mTicksOn) {
          while (mXTickIterator->GetNextTick (theX, theIsMajorTick, theFormatString)) {
              if (!DrawXTick (theX, theY1, theIsMajorTick, theFormatString, inPainter, theTickRect)) {
                  return false;
              }
              
              if (theTickRect.mY+theTickRect.mH>theYMax) {
                  theYMax = theTickRect.mY+theTickRect.mH;
              }
          }
      }

      if (theYMax>theRect.mY+theRect.mH) {
        theRect.mH = theYMax-theRect.mY;
      }

      inPainter.SetStyle (mXAxisSetup.mStyle);
      string theLabel = mXAxisSetup.mLabel;
      if (theLabel.size ()>0) {
        int theW = inPainter.CalculateTextDrawSize (theLabel.c_str ());
        int theX = theRect.mX + (theRect.mW-theW)/2;
        int theY = theRect.mY+theRect.mH+inPainter.GetFontHeight ();
        inPainter.DrawText (theX, theY, theLabel.c_str ());
      }
      return true;
    }